

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiKeyRoutingData *pIVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  if ((((uint)flags >> 0xd & 1) == 0) || (GImGui->NavWindow != (ImGuiWindow *)0x0)) {
    if (((uint)flags >> 0xc & 1) != 0) {
      return true;
    }
    if (((uint)flags >> 8 & 1) == 0) {
      if (((uint)flags >> 10 & 1) == 0) {
        uVar3 = (flags << 0x16) >> 0x1f & 0xfe;
      }
      else {
        uVar3 = 2;
      }
    }
    else {
      pIVar2 = GImGui->NavWindow;
      if ((owner_id == 0) || (GImGui->ActiveId != owner_id)) {
        if ((pIVar2 != (ImGuiWindow *)0x0) &&
           (pIVar2->RootWindow == GImGui->CurrentWindow->RootWindow)) {
          iVar4 = -3;
          while (pIVar2 != (ImGuiWindow *)0x0) {
            if (pIVar2 == GImGui->CurrentWindow) {
              if (iVar4 != -0xff) {
                uVar3 = -iVar4;
                goto LAB_001ccf00;
              }
              break;
            }
            if (pIVar2->RootWindow == pIVar2) {
              pIVar2 = (ImGuiWindow *)0x0;
            }
            else {
              pIVar2 = pIVar2->ParentWindow;
            }
            iVar4 = iVar4 + -1;
          }
        }
        goto LAB_001ccef9;
      }
      uVar3 = 1;
    }
LAB_001ccf00:
    pIVar1 = GetShortcutRoutingData(key_chord);
    if (0xfffffffd < owner_id - 1) {
      owner_id = GImGui->CurrentFocusScopeId;
    }
    if (uVar3 < pIVar1->RoutingNextScore) {
      pIVar1->RoutingNext = owner_id;
      pIVar1->RoutingNextScore = (ImU8)uVar3;
    }
    bVar5 = pIVar1->RoutingCurr == owner_id;
  }
  else {
LAB_001ccef9:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiInputFlags_RouteMask_) == 0)
        flags |= ImGuiInputFlags_RouteGlobalHigh; // IMPORTANT: This is the default for SetShortcutRouting() but NOT Shortcut()
    else
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiInputFlags_RouteMask_)); // Check that only 1 routing flag is used

    if (flags & ImGuiInputFlags_RouteUnlessBgFocused)
        if (g.NavWindow == NULL)
            return false;
    if (flags & ImGuiInputFlags_RouteAlways)
        return true;

    const int score = CalcRoutingScore(g.CurrentWindow, owner_id, flags);
    if (score == 255)
        return false;

    // Submit routing for NEXT frame (assuming score is sufficient)
    // FIXME: Could expose a way to use a "serve last" policy for same score resolution (using <= instead of <).
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord);
    const ImGuiID routing_id = GetRoutingIdFromOwnerId(owner_id);
    //const bool set_route = (flags & ImGuiInputFlags_ServeLast) ? (score <= routing_data->RoutingNextScore) : (score < routing_data->RoutingNextScore);
    if (score < routing_data->RoutingNextScore)
    {
        routing_data->RoutingNext = routing_id;
        routing_data->RoutingNextScore = (ImU8)score;
    }

    // Return routing state for CURRENT frame
    return routing_data->RoutingCurr == routing_id;
}